

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

void Ver_ParsePrintErrorMessage(Ver_Man_t *p)

{
  char *pcVar1;
  FILE *__stream;
  uint uVar2;
  
  p->fError = 1;
  pcVar1 = p->pFileName;
  __stream = (FILE *)p->Output;
  if (p->fTopLevel == 0) {
    uVar2 = Ver_StreamGetLineNumber(p->pReader);
    fprintf(__stream,"%s (line %d): %s\n",pcVar1,(ulong)uVar2,p->sError);
  }
  else {
    fprintf(__stream,"%s: %s\n",pcVar1,p->sError);
  }
  if (p->pDesign != (Abc_Des_t *)0x0) {
    Abc_DesFree(p->pDesign,(Abc_Ntk_t *)0x0);
    p->pDesign = (Abc_Des_t *)0x0;
  }
  return;
}

Assistant:

void Ver_ParsePrintErrorMessage( Ver_Man_t * p )
{
    p->fError = 1;
    if ( p->fTopLevel ) // the line number is not given
        fprintf( p->Output, "%s: %s\n", p->pFileName, p->sError );
    else // print the error message with the line number
        fprintf( p->Output, "%s (line %d): %s\n", 
            p->pFileName, Ver_StreamGetLineNumber(p->pReader), p->sError );
    // free the data
    Ver_ParseFreeData( p );
}